

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_bufs.c
# Opt level: O1

MPP_RET hal_bufs_deinit(HalBufs bufs)

{
  MPP_RET MVar1;
  MPP_RET MVar2;
  
  if (bufs == (HalBufs)0x0) {
    _mpp_log_l(2,"hal_bufs","invalid NULL input\n","hal_bufs_deinit");
    MVar1 = MPP_ERR_NULL_PTR;
  }
  else {
    if (((byte)hal_bufs_debug & 1) != 0) {
      _mpp_log_l(4,"hal_bufs","enter\n","hal_bufs_deinit");
    }
    MVar1 = hal_bufs_clear((HalBufsImpl *)bufs);
    if (*bufs != (MppBufferGroup)0x0) {
      MVar2 = mpp_buffer_group_put(*bufs);
      MVar1 = MVar1 | MVar2;
      *(undefined8 *)bufs = 0;
    }
    *(undefined8 *)((long)bufs + 0x50) = 0;
    *(undefined8 *)((long)bufs + 0x58) = 0;
    *(undefined8 *)((long)bufs + 0x40) = 0;
    *(undefined8 *)((long)bufs + 0x48) = 0;
    *(undefined8 *)((long)bufs + 0x30) = 0;
    *(undefined8 *)((long)bufs + 0x38) = 0;
    *(undefined8 *)((long)bufs + 0x20) = 0;
    *(undefined8 *)((long)bufs + 0x28) = 0;
    *(undefined8 *)((long)bufs + 0x10) = 0;
    *(undefined8 *)((long)bufs + 0x18) = 0;
    *(undefined8 *)bufs = 0;
    *(undefined8 *)((long)bufs + 8) = 0;
    *(undefined8 *)((long)bufs + 0x60) = 0;
    mpp_osal_free("hal_bufs_deinit",bufs);
    if (((byte)hal_bufs_debug & 1) != 0) {
      _mpp_log_l(4,"hal_bufs","leave\n","hal_bufs_deinit");
    }
  }
  return MVar1;
}

Assistant:

MPP_RET hal_bufs_deinit(HalBufs bufs)
{
    HalBufsImpl *impl = (HalBufsImpl *)bufs;
    MPP_RET ret = MPP_OK;

    if (NULL == bufs) {
        mpp_err_f("invalid NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    hal_bufs_enter();

    ret = hal_bufs_clear(impl);

    if (impl->group) {
        ret |= mpp_buffer_group_put(impl->group);
        impl->group = NULL;
    }

    memset(impl, 0, sizeof(*impl));
    MPP_FREE(impl);

    hal_bufs_leave();

    return ret;
}